

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall google::protobuf::MessageLite::ParseFromIstream(MessageLite *this,istream *input)

{
  bool bVar1;
  IstreamInputStream *in_RDI;
  IstreamInputStream zero_copy_input;
  undefined5 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  byte bVar2;
  int in_stack_ffffffffffffff94;
  istream *in_stack_ffffffffffffff98;
  IstreamInputStream *in_stack_ffffffffffffffa0;
  
  io::IstreamInputStream::IstreamInputStream
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  bVar1 = ParseFromZeroCopyStream
                    ((MessageLite *)in_RDI,
                     (ZeroCopyInputStream *)
                     CONCAT17(in_stack_ffffffffffffff7f,
                              CONCAT16(in_stack_ffffffffffffff7e,
                                       CONCAT15(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff78)
                                      )));
  bVar2 = 0;
  if (bVar1) {
    bVar2 = std::ios::eof();
  }
  io::IstreamInputStream::~IstreamInputStream(in_RDI);
  return (bool)(bVar2 & 1);
}

Assistant:

bool MessageLite::ParseFromIstream(std::istream* input) {
  io::IstreamInputStream zero_copy_input(input);
  return ParseFromZeroCopyStream(&zero_copy_input) && input->eof();
}